

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void google::protobuf::io::AppendUTF8(uint32_t code_point,string *output)

{
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_30;
  int local_20;
  uint32_t local_1c;
  int len;
  uint32_t tmp;
  string *output_local;
  uint32_t code_point_local;
  
  local_1c = 0;
  local_20 = 0;
  _len = output;
  output_local._4_4_ = code_point;
  if (code_point < 0x80) {
    local_20 = 1;
    local_1c = code_point;
  }
  else if (code_point < 0x800) {
    local_1c = (code_point & 0x7c0) << 2 | 0xc080 | code_point & 0x3f;
    local_20 = 2;
  }
  else if (code_point < 0x10000) {
    local_1c = (code_point & 0xf000) << 4 | 0xe08080 | (code_point & 0xfc0) << 2 | code_point & 0x3f
    ;
    local_20 = 3;
  }
  else {
    if (0x10ffff < code_point) {
      absl::lts_20250127::str_format_internal::
      FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::FormatSpecTemplate
                (&local_30,"\\U%08x");
      absl::lts_20250127::StrAppendFormat<unsigned_int>
                (output,&local_30,(uint *)((long)&output_local + 4));
      return;
    }
    local_1c = (code_point & 0x1c0000) << 6 | 0xf0808080 | (code_point & 0x3f000) << 4 |
               (code_point & 0xfc0) << 2 | code_point & 0x3f;
    local_20 = 4;
  }
  local_1c = ghtonl(local_1c);
  std::__cxx11::string::append((char *)_len,(long)&len - (long)local_20);
  return;
}

Assistant:

static void AppendUTF8(uint32_t code_point, std::string* output) {
  uint32_t tmp = 0;
  int len = 0;
  if (code_point <= 0x7f) {
    tmp = code_point;
    len = 1;
  } else if (code_point <= 0x07ff) {
    tmp = 0x0000c080 | ((code_point & 0x07c0) << 2) | (code_point & 0x003f);
    len = 2;
  } else if (code_point <= 0xffff) {
    tmp = 0x00e08080 | ((code_point & 0xf000) << 4) |
          ((code_point & 0x0fc0) << 2) | (code_point & 0x003f);
    len = 3;
  } else if (code_point <= 0x10ffff) {
    tmp = 0xf0808080 | ((code_point & 0x1c0000) << 6) |
          ((code_point & 0x03f000) << 4) | ((code_point & 0x000fc0) << 2) |
          (code_point & 0x003f);
    len = 4;
  } else {
    // Unicode code points end at 0x10FFFF, so this is out-of-range.
    // ConsumeString permits hex values up to 0x1FFFFF, and FetchUnicodePoint
    // doesn't perform a range check.
    absl::StrAppendFormat(output, "\\U%08x", code_point);
    return;
  }
  tmp = ghtonl(tmp);
  output->append(reinterpret_cast<const char*>(&tmp) + sizeof(tmp) - len, len);
}